

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall CConfigManager::Save(CConfigManager *this,char *pFilename)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  char *b;
  char *a;
  int i;
  char *pFilename_local;
  CConfigManager *this_local;
  char aBuf [256];
  char aEscapeBuf [2048];
  char aLineBuf [2048];
  
  aEscapeBuf[8] = '\0';
  aEscapeBuf[9] = '\0';
  aEscapeBuf[10] = '\0';
  aEscapeBuf[0xb] = '\0';
  aEscapeBuf[0xc] = '\0';
  aEscapeBuf[0xd] = '\0';
  aEscapeBuf[0xe] = '\0';
  aEscapeBuf[0xf] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_pStorage != (IStorage *)0x0) {
    pFilename_local = pFilename;
    if (pFilename == (char *)0x0) {
      pFilename_local = "settings07.cfg";
    }
    b = (char *)0x0;
    a = (char *)0x0;
    iVar2 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[4])
                      (this->m_pStorage,pFilename_local,2,0,0);
    this->m_ConfigFile = (IOHANDLE)CONCAT44(extraout_var,iVar2);
    if (this->m_ConfigFile != (IOHANDLE)0x0) {
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,"# Teeworlds 0.7.5")
      ;
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClPredict != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_predict",(ulong)(uint)(this->m_Values).m_ClPredict);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClPredictPlayers != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_predict_players",
                   (ulong)(uint)(this->m_Values).m_ClPredictPlayers);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClPredictProjectiles != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_predict_projectiles",
                   (ulong)(uint)(this->m_Values).m_ClPredictProjectiles);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClNameplates != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_nameplates",
                   (ulong)(uint)(this->m_Values).m_ClNameplates);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClNameplatesAlways != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_nameplates_always",
                   (ulong)(uint)(this->m_Values).m_ClNameplatesAlways);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClNameplatesTeamcolors != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_nameplates_teamcolors",
                   (ulong)(uint)(this->m_Values).m_ClNameplatesTeamcolors);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClNameplatesSize != 0x32)) {
        str_format(aLineBuf,0x800,"%s %i","cl_nameplates_size",
                   (ulong)(uint)(this->m_Values).m_ClNameplatesSize);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClAutoswitchWeapons != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_autoswitch_weapons",
                   (ulong)(uint)(this->m_Values).m_ClAutoswitchWeapons);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClShowhud != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_showhud",(ulong)(uint)(this->m_Values).m_ClShowhud);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClShowChat != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_showchat",(ulong)(uint)(this->m_Values).m_ClShowChat);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClFilterchat != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_filterchat",
                   (ulong)(uint)(this->m_Values).m_ClFilterchat);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClDisableWhisper != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_disable_whisper",
                   (ulong)(uint)(this->m_Values).m_ClDisableWhisper);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClShowsocial != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_showsocial",
                   (ulong)(uint)(this->m_Values).m_ClShowsocial);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClShowfps != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_showfps",(ulong)(uint)(this->m_Values).m_ClShowfps);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClAirjumpindicator != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_airjumpindicator",
                   (ulong)(uint)(this->m_Values).m_ClAirjumpindicator);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClWarningTeambalance != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_warning_teambalance",
                   (ulong)(uint)(this->m_Values).m_ClWarningTeambalance);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClDynamicCamera != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_dynamic_camera",
                   (ulong)(uint)(this->m_Values).m_ClDynamicCamera);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClMouseDeadzone != 300)) {
        str_format(aLineBuf,0x800,"%s %i","cl_mouse_deadzone",
                   (ulong)(uint)(this->m_Values).m_ClMouseDeadzone);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClMouseFollowfactor != 0x3c)) {
        str_format(aLineBuf,0x800,"%s %i","cl_mouse_followfactor",
                   (ulong)(uint)(this->m_Values).m_ClMouseFollowfactor);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClMouseMaxDistanceDynamic != 1000))
      {
        str_format(aLineBuf,0x800,"%s %i","cl_mouse_max_distance_dynamic",
                   (ulong)(uint)(this->m_Values).m_ClMouseMaxDistanceDynamic);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClMouseMaxDistanceStatic != 400)) {
        str_format(aLineBuf,0x800,"%s %i","cl_mouse_max_distance_static",
                   (ulong)(uint)(this->m_Values).m_ClMouseMaxDistanceStatic);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClCameraSmoothness != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_camera_smoothness",
                   (ulong)(uint)(this->m_Values).m_ClCameraSmoothness);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClCameraStabilizing != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_camera_stabilizing",
                   (ulong)(uint)(this->m_Values).m_ClCameraStabilizing);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClCustomizeSkin != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_customize_skin",
                   (ulong)(uint)(this->m_Values).m_ClCustomizeSkin);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClShowUserId != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_show_user_id",
                   (ulong)(uint)(this->m_Values).m_ClShowUserId);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_EdZoomTarget != 1)) {
        str_format(aLineBuf,0x800,"%s %i","ed_zoom_target",
                   (ulong)(uint)(this->m_Values).m_EdZoomTarget);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_EdShowkeys != 0)) {
        str_format(aLineBuf,0x800,"%s %i","ed_showkeys",(ulong)(uint)(this->m_Values).m_EdShowkeys);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_EdColorGridInner != -0xda)) {
        str_format(aLineBuf,0x800,"%s %i","ed_color_grid_inner",
                   (ulong)(uint)(this->m_Values).m_EdColorGridInner);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_EdColorGridOuter != -0xb3b3b4)) {
        str_format(aLineBuf,0x800,"%s %i","ed_color_grid_outer",
                   (ulong)(uint)(this->m_Values).m_EdColorGridOuter);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_EdColorQuadPoint != -0xffff01)) {
        str_format(aLineBuf,0x800,"%s %i","ed_color_quad_point",
                   (ulong)(uint)(this->m_Values).m_EdColorQuadPoint);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_EdColorQuadPointHover != -1)) {
        str_format(aLineBuf,0x800,"%s %i","ed_color_quad_point_hover",
                   (ulong)(uint)(this->m_Values).m_EdColorQuadPointHover);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_EdColorQuadPointActive != -1)) {
        str_format(aLineBuf,0x800,"%s %i","ed_color_quad_point_active",
                   (ulong)(uint)(this->m_Values).m_EdColorQuadPointActive);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_EdColorQuadPivot != 0xff00ff)) {
        str_format(aLineBuf,0x800,"%s %i","ed_color_quad_pivot",
                   (ulong)(uint)(this->m_Values).m_EdColorQuadPivot);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_EdColorQuadPivotHover != -1)) {
        str_format(aLineBuf,0x800,"%s %i","ed_color_quad_pivot_hover",
                   (ulong)(uint)(this->m_Values).m_EdColorQuadPivotHover);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_EdColorQuadPivotActive != -1)) {
        str_format(aLineBuf,0x800,"%s %i","ed_color_quad_pivot_active",
                   (ulong)(uint)(this->m_Values).m_EdColorQuadPivotActive);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_EdColorSelectionQuad != -1)) {
        str_format(aLineBuf,0x800,"%s %i","ed_color_selection_quad",
                   (ulong)(uint)(this->m_Values).m_EdColorSelectionQuad);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_EdColorSelectionTile != -0x9a)) {
        str_format(aLineBuf,0x800,"%s %i","ed_color_selection_tile",
                   (ulong)(uint)(this->m_Values).m_EdColorSelectionTile);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClShowWelcome != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_show_welcome",
                   (ulong)(uint)(this->m_Values).m_ClShowWelcome);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClMotdTime != 10)) {
        str_format(aLineBuf,0x800,"%s %i","cl_motd_time",(ulong)(uint)(this->m_Values).m_ClMotdTime)
        ;
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClShowXmasHats != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_show_xmas_hats",
                   (ulong)(uint)(this->m_Values).m_ClShowXmasHats);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClShowEasterEggs != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_show_easter_eggs",
                   (ulong)(uint)(this->m_Values).m_ClShowEasterEggs);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_ClVersionServer,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","cl_version_server",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_ClLanguagefile,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","cl_languagefile",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_PlayerColorBody != 0x1b6f74)) {
        str_format(aLineBuf,0x800,"%s %i","player_color_body",
                   (ulong)(uint)(this->m_Values).m_PlayerColorBody);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_PlayerColorMarking != -0xffff01)) {
        str_format(aLineBuf,0x800,"%s %i","player_color_marking",
                   (ulong)(uint)(this->m_Values).m_PlayerColorMarking);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_PlayerColorDecoration != 0x1b6f74))
      {
        str_format(aLineBuf,0x800,"%s %i","player_color_decoration",
                   (ulong)(uint)(this->m_Values).m_PlayerColorDecoration);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_PlayerColorHands != 0x1b759e)) {
        str_format(aLineBuf,0x800,"%s %i","player_color_hands",
                   (ulong)(uint)(this->m_Values).m_PlayerColorHands);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_PlayerColorFeet != 0x1c873e)) {
        str_format(aLineBuf,0x800,"%s %i","player_color_feet",
                   (ulong)(uint)(this->m_Values).m_PlayerColorFeet);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_PlayerColorEyes != 0xff)) {
        str_format(aLineBuf,0x800,"%s %i","player_color_eyes",
                   (ulong)(uint)(this->m_Values).m_PlayerColorEyes);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_PlayerUseCustomColorBody != 1)) {
        str_format(aLineBuf,0x800,"%s %i","player_use_custom_color_body",
                   (ulong)(uint)(this->m_Values).m_PlayerUseCustomColorBody);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_PlayerUseCustomColorMarking != 1)) {
        str_format(aLineBuf,0x800,"%s %i","player_use_custom_color_marking",
                   (ulong)(uint)(this->m_Values).m_PlayerUseCustomColorMarking);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_PlayerUseCustomColorDecoration != 1)
         ) {
        str_format(aLineBuf,0x800,"%s %i","player_use_custom_color_decoration",
                   (ulong)(uint)(this->m_Values).m_PlayerUseCustomColorDecoration);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_PlayerUseCustomColorHands != 1)) {
        str_format(aLineBuf,0x800,"%s %i","player_use_custom_color_hands",
                   (ulong)(uint)(this->m_Values).m_PlayerUseCustomColorHands);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_PlayerUseCustomColorFeet != 1)) {
        str_format(aLineBuf,0x800,"%s %i","player_use_custom_color_feet",
                   (ulong)(uint)(this->m_Values).m_PlayerUseCustomColorFeet);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_PlayerUseCustomColorEyes != 1)) {
        str_format(aLineBuf,0x800,"%s %i","player_use_custom_color_eyes",
                   (ulong)(uint)(this->m_Values).m_PlayerUseCustomColorEyes);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_PlayerSkin,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","player_skin",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_PlayerSkinBody,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_body",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_PlayerSkinMarking,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_marking",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_PlayerSkinDecoration,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_decoration",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_PlayerSkinHands,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_hands",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_PlayerSkinFeet,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_feet",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_PlayerSkinEyes,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_eyes",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_UiBrowserPage != 5)) {
        str_format(aLineBuf,0x800,"%s %i","ui_browser_page",
                   (ulong)(uint)(this->m_Values).m_UiBrowserPage);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_UiSettingsPage != 0)) {
        str_format(aLineBuf,0x800,"%s %i","ui_settings_page",
                   (ulong)(uint)(this->m_Values).m_UiSettingsPage);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_UiServerAddress,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","ui_server_address",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_UiServerAddressLan,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","ui_server_address_lan",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_UiMousesens != 100)) {
        str_format(aLineBuf,0x800,"%s %i","ui_mousesens",(ulong)(uint)(this->m_Values).m_UiMousesens
                  );
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_UiJoystickSens != 100)) {
        str_format(aLineBuf,0x800,"%s %i","ui_joystick_sens",
                   (ulong)(uint)(this->m_Values).m_UiJoystickSens);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_UiAutoswitchInfotab != 1)) {
        str_format(aLineBuf,0x800,"%s %i","ui_autoswitch_infotab",
                   (ulong)(uint)(this->m_Values).m_UiAutoswitchInfotab);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_UiWideview != 0)) {
        str_format(aLineBuf,0x800,"%s %i","ui_wideview",(ulong)(uint)(this->m_Values).m_UiWideview);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxNoclip != 0)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_noclip",(ulong)(uint)(this->m_Values).m_GfxNoclip);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_ClMenuMap,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","cl_menu_map",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClShowMenuMap != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_show_menu_map",
                   (ulong)(uint)(this->m_Values).m_ClShowMenuMap);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClMenuAlpha != 0x19)) {
        str_format(aLineBuf,0x800,"%s %i","cl_menu_alpha",
                   (ulong)(uint)(this->m_Values).m_ClMenuAlpha);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClRotationRadius != 0x1e)) {
        str_format(aLineBuf,0x800,"%s %i","cl_rotation_radius",
                   (ulong)(uint)(this->m_Values).m_ClRotationRadius);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClRotationSpeed != 0x28)) {
        str_format(aLineBuf,0x800,"%s %i","cl_rotation_speed",
                   (ulong)(uint)(this->m_Values).m_ClRotationSpeed);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClCameraSpeed != 5)) {
        str_format(aLineBuf,0x800,"%s %i","cl_camera_speed",
                   (ulong)(uint)(this->m_Values).m_ClCameraSpeed);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClShowStartMenuImages != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_show_start_menu_images",
                   (ulong)(uint)(this->m_Values).m_ClShowStartMenuImages);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClSkipStartMenu != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_skip_start_menu",
                   (ulong)(uint)(this->m_Values).m_ClSkipStartMenu);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClHideSelfScore != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_hide_self_score",
                   (ulong)(uint)(this->m_Values).m_ClHideSelfScore);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClStatboardInfos != 0x4eb)) {
        str_format(aLineBuf,0x800,"%s %i","cl_statboard_infos",
                   (ulong)(uint)(this->m_Values).m_ClStatboardInfos);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClShowLocalTimeAlways != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_show_local_time_always",
                   (ulong)(uint)(this->m_Values).m_ClShowLocalTimeAlways);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClLastVersionPlayed != 0x704)) {
        str_format(aLineBuf,0x800,"%s %i","cl_last_version_played",
                   (ulong)(uint)(this->m_Values).m_ClLastVersionPlayed);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvWarmup != 0)) {
        str_format(aLineBuf,0x800,"%s %i","sv_warmup",(ulong)(uint)(this->m_Values).m_SvWarmup);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvCountdown != 0)) {
        str_format(aLineBuf,0x800,"%s %i","sv_countdown",(ulong)(uint)(this->m_Values).m_SvCountdown
                  );
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_SvMotd,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","sv_motd",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvTeamdamage != 0)) {
        str_format(aLineBuf,0x800,"%s %i","sv_teamdamage",
                   (ulong)(uint)(this->m_Values).m_SvTeamdamage);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_SvMaprotation,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","sv_maprotation",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvMatchesPerMap != 1)) {
        str_format(aLineBuf,0x800,"%s %i","sv_matches_per_map",
                   (ulong)(uint)(this->m_Values).m_SvMatchesPerMap);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvMatchSwap != 1)) {
        str_format(aLineBuf,0x800,"%s %i","sv_match_swap",
                   (ulong)(uint)(this->m_Values).m_SvMatchSwap);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvPowerups != 1)) {
        str_format(aLineBuf,0x800,"%s %i","sv_powerups",(ulong)(uint)(this->m_Values).m_SvPowerups);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvScorelimit != 0x14)) {
        str_format(aLineBuf,0x800,"%s %i","sv_scorelimit",
                   (ulong)(uint)(this->m_Values).m_SvScorelimit);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvTimelimit != 0)) {
        str_format(aLineBuf,0x800,"%s %i","sv_timelimit",(ulong)(uint)(this->m_Values).m_SvTimelimit
                  );
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_SvGametype,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","sv_gametype",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvTournamentMode != 0)) {
        str_format(aLineBuf,0x800,"%s %i","sv_tournament_mode",
                   (ulong)(uint)(this->m_Values).m_SvTournamentMode);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvPlayerReadyMode != 0)) {
        str_format(aLineBuf,0x800,"%s %i","sv_player_ready_mode",
                   (ulong)(uint)(this->m_Values).m_SvPlayerReadyMode);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvSpamprotection != 1)) {
        str_format(aLineBuf,0x800,"%s %i","sv_spamprotection",
                   (ulong)(uint)(this->m_Values).m_SvSpamprotection);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvRespawnDelayTDM != 3)) {
        str_format(aLineBuf,0x800,"%s %i","sv_respawn_delay_tdm",
                   (ulong)(uint)(this->m_Values).m_SvRespawnDelayTDM);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvPlayerSlots != 8)) {
        str_format(aLineBuf,0x800,"%s %i","sv_player_slots",
                   (ulong)(uint)(this->m_Values).m_SvPlayerSlots);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvSkillLevel != 1)) {
        str_format(aLineBuf,0x800,"%s %i","sv_skill_level",
                   (ulong)(uint)(this->m_Values).m_SvSkillLevel);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvTeambalanceTime != 1)) {
        str_format(aLineBuf,0x800,"%s %i","sv_teambalance_time",
                   (ulong)(uint)(this->m_Values).m_SvTeambalanceTime);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvInactiveKickTime != 3)) {
        str_format(aLineBuf,0x800,"%s %i","sv_inactivekick_time",
                   (ulong)(uint)(this->m_Values).m_SvInactiveKickTime);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvInactiveKick != 2)) {
        str_format(aLineBuf,0x800,"%s %i","sv_inactivekick",
                   (ulong)(uint)(this->m_Values).m_SvInactiveKick);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvInactiveKickSpec != 0)) {
        str_format(aLineBuf,0x800,"%s %i","sv_inactivekick_spec",
                   (ulong)(uint)(this->m_Values).m_SvInactiveKickSpec);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvSilentSpectatorMode != 1)) {
        str_format(aLineBuf,0x800,"%s %i","sv_silent_spectator_mode",
                   (ulong)(uint)(this->m_Values).m_SvSilentSpectatorMode);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvStrictSpectateMode != 0)) {
        str_format(aLineBuf,0x800,"%s %i","sv_strict_spectate_mode",
                   (ulong)(uint)(this->m_Values).m_SvStrictSpectateMode);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvVoteSpectate != 1)) {
        str_format(aLineBuf,0x800,"%s %i","sv_vote_spectate",
                   (ulong)(uint)(this->m_Values).m_SvVoteSpectate);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvVoteSpectateRejoindelay != 3)) {
        str_format(aLineBuf,0x800,"%s %i","sv_vote_spectate_rejoindelay",
                   (ulong)(uint)(this->m_Values).m_SvVoteSpectateRejoindelay);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvVoteKick != 1)) {
        str_format(aLineBuf,0x800,"%s %i","sv_vote_kick",(ulong)(uint)(this->m_Values).m_SvVoteKick)
        ;
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvVoteKickMin != 0)) {
        str_format(aLineBuf,0x800,"%s %i","sv_vote_kick_min",
                   (ulong)(uint)(this->m_Values).m_SvVoteKickMin);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvVoteKickBantime != 5)) {
        str_format(aLineBuf,0x800,"%s %i","sv_vote_kick_bantime",
                   (ulong)(uint)(this->m_Values).m_SvVoteKickBantime);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_PlayerName,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","player_name",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_PlayerClan,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","player_clan",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_PlayerCountry != -1)) {
        str_format(aLineBuf,0x800,"%s %i","player_country",
                   (ulong)(uint)(this->m_Values).m_PlayerCountry);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 7U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_Password,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","password",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 7U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_Logfile,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","logfile",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 7U) != 0) && ((this->m_Values).m_LogfileTimestamp != 0)) {
        str_format(aLineBuf,0x800,"%s %i","logfile_timestamp",
                   (ulong)(uint)(this->m_Values).m_LogfileTimestamp);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 7U) != 0) && ((this->m_Values).m_ConsoleOutputLevel != 0)) {
        str_format(aLineBuf,0x800,"%s %i","console_output_level",
                   (ulong)(uint)(this->m_Values).m_ConsoleOutputLevel);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ShowConsoleWindow != 1)) {
        str_format(aLineBuf,0x800,"%s %i","show_console_window",
                   (ulong)(uint)(this->m_Values).m_ShowConsoleWindow);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClCpuThrottle != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_cpu_throttle",
                   (ulong)(uint)(this->m_Values).m_ClCpuThrottle);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClLoadCountryFlags != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_load_country_flags",
                   (ulong)(uint)(this->m_Values).m_ClLoadCountryFlags);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClAutoDemoRecord != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_auto_demo_record",
                   (ulong)(uint)(this->m_Values).m_ClAutoDemoRecord);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClAutoDemoMax != 10)) {
        str_format(aLineBuf,0x800,"%s %i","cl_auto_demo_max",
                   (ulong)(uint)(this->m_Values).m_ClAutoDemoMax);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClAutoScreenshot != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_auto_screenshot",
                   (ulong)(uint)(this->m_Values).m_ClAutoScreenshot);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClAutoStatScreenshot != 0)) {
        str_format(aLineBuf,0x800,"%s %i","cl_auto_statscreenshot",
                   (ulong)(uint)(this->m_Values).m_ClAutoStatScreenshot);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClAutoScreenshotMax != 10)) {
        str_format(aLineBuf,0x800,"%s %i","cl_auto_screenshot_max",
                   (ulong)(uint)(this->m_Values).m_ClAutoScreenshotMax);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClShowServerBroadcast != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_show_server_broadcast",
                   (ulong)(uint)(this->m_Values).m_ClShowServerBroadcast);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClColoredBroadcast != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_colored_broadcast",
                   (ulong)(uint)(this->m_Values).m_ClColoredBroadcast);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_ClSaveServerPasswords != 1)) {
        str_format(aLineBuf,0x800,"%s %i","cl_save_server_passwords",
                   (ulong)(uint)(this->m_Values).m_ClSaveServerPasswords);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_BrFilterString,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","br_filter_string",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_BrSort != 4)) {
        str_format(aLineBuf,0x800,"%s %i","br_sort",(ulong)(uint)(this->m_Values).m_BrSort);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_BrSortOrder != 1)) {
        str_format(aLineBuf,0x800,"%s %i","br_sort_order",
                   (ulong)(uint)(this->m_Values).m_BrSortOrder);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_BrMaxRequests != 0x19)) {
        str_format(aLineBuf,0x800,"%s %i","br_max_requests",
                   (ulong)(uint)(this->m_Values).m_BrMaxRequests);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_BrDemoSort != 0)) {
        str_format(aLineBuf,0x800,"%s %i","br_demo_sort",(ulong)(uint)(this->m_Values).m_BrDemoSort)
        ;
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_BrDemoSortOrder != 0)) {
        str_format(aLineBuf,0x800,"%s %i","br_demo_sort_order",
                   (ulong)(uint)(this->m_Values).m_BrDemoSortOrder);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_SndBufferSize != 0x200)) {
        str_format(aLineBuf,0x800,"%s %i","snd_buffer_size",
                   (ulong)(uint)(this->m_Values).m_SndBufferSize);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_SndRate != 48000)) {
        str_format(aLineBuf,0x800,"%s %i","snd_rate",(ulong)(uint)(this->m_Values).m_SndRate);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_SndEnable != 1)) {
        str_format(aLineBuf,0x800,"%s %i","snd_enable",(ulong)(uint)(this->m_Values).m_SndEnable);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_SndInit != 1)) {
        str_format(aLineBuf,0x800,"%s %i","snd_init",(ulong)(uint)(this->m_Values).m_SndInit);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_SndMusic != 1)) {
        str_format(aLineBuf,0x800,"%s %i","snd_enable_music",
                   (ulong)(uint)(this->m_Values).m_SndMusic);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_SndVolume != 100)) {
        str_format(aLineBuf,0x800,"%s %i","snd_volume",(ulong)(uint)(this->m_Values).m_SndVolume);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_SndNonactiveMute != 0)) {
        str_format(aLineBuf,0x800,"%s %i","snd_nonactive_mute",
                   (ulong)(uint)(this->m_Values).m_SndNonactiveMute);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_SndAsyncLoading != 1)) {
        str_format(aLineBuf,0x800,"%s %i","snd_async_loading",
                   (ulong)(uint)(this->m_Values).m_SndAsyncLoading);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxScreen != 0)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_screen",(ulong)(uint)(this->m_Values).m_GfxScreen);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxScreenWidth != 0)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_screen_width",
                   (ulong)(uint)(this->m_Values).m_GfxScreenWidth);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxScreenHeight != 0)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_screen_height",
                   (ulong)(uint)(this->m_Values).m_GfxScreenHeight);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxBorderless != 0)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_borderless",
                   (ulong)(uint)(this->m_Values).m_GfxBorderless);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxFullscreen != 1)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_fullscreen",
                   (ulong)(uint)(this->m_Values).m_GfxFullscreen);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxClear != 0)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_clear",(ulong)(uint)(this->m_Values).m_GfxClear);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxVsync != 1)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_vsync",(ulong)(uint)(this->m_Values).m_GfxVsync);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxDisplayAllModes != 0)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_display_all_modes",
                   (ulong)(uint)(this->m_Values).m_GfxDisplayAllModes);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxHighdpi != 1)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_highdpi",(ulong)(uint)(this->m_Values).m_GfxHighdpi);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxTextureCompression != 0)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_texture_compression",
                   (ulong)(uint)(this->m_Values).m_GfxTextureCompression);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxHighDetail != 1)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_high_detail",
                   (ulong)(uint)(this->m_Values).m_GfxHighDetail);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxTextureQuality != 1)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_texture_quality",
                   (ulong)(uint)(this->m_Values).m_GfxTextureQuality);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxFsaaSamples != 0)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_fsaa_samples",
                   (ulong)(uint)(this->m_Values).m_GfxFsaaSamples);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxFinish != 1)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_finish",(ulong)(uint)(this->m_Values).m_GfxFinish);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxAsyncRender != 0)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_asyncrender",
                   (ulong)(uint)(this->m_Values).m_GfxAsyncRender);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxMaxFps != 0x90)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_maxfps",(ulong)(uint)(this->m_Values).m_GfxMaxFps);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxLimitFps != 0)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_limitfps",(ulong)(uint)(this->m_Values).m_GfxLimitFps
                  );
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_GfxUseX11XRandRWM != 1)) {
        str_format(aLineBuf,0x800,"%s %i","gfx_use_x11xrandr_wm",
                   (ulong)(uint)(this->m_Values).m_GfxUseX11XRandRWM);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_InpGrab != 0)) {
        str_format(aLineBuf,0x800,"%s %i","inp_grab",(ulong)(uint)(this->m_Values).m_InpGrab);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_InpMousesens != 100)) {
        str_format(aLineBuf,0x800,"%s %i","inp_mousesens",
                   (ulong)(uint)(this->m_Values).m_InpMousesens);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_JoystickEnable != 0)) {
        str_format(aLineBuf,0x800,"%s %i","joystick_enable",
                   (ulong)(uint)(this->m_Values).m_JoystickEnable);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_JoystickGUID,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","joystick_guid",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_JoystickAbsolute != 0)) {
        str_format(aLineBuf,0x800,"%s %i","joystick_absolute",
                   (ulong)(uint)(this->m_Values).m_JoystickAbsolute);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_JoystickSens != 100)) {
        str_format(aLineBuf,0x800,"%s %i","joystick_sens",
                   (ulong)(uint)(this->m_Values).m_JoystickSens);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_JoystickX != 0)) {
        str_format(aLineBuf,0x800,"%s %i","joystick_x",(ulong)(uint)(this->m_Values).m_JoystickX);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_JoystickY != 1)) {
        str_format(aLineBuf,0x800,"%s %i","joystick_y",(ulong)(uint)(this->m_Values).m_JoystickY);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 3U) != 0) && ((this->m_Values).m_JoystickTolerance != 5)) {
        str_format(aLineBuf,0x800,"%s %i","joystick_tolerance",
                   (ulong)(uint)(this->m_Values).m_JoystickTolerance);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_SvName,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","sv_name",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_SvHostname,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","sv_hostname",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 0x17U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_Bindaddr,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","bindaddr",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvPort != 0x206f)) {
        str_format(aLineBuf,0x800,"%s %i","sv_port",(ulong)(uint)(this->m_Values).m_SvPort);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvExternalPort != 0)) {
        str_format(aLineBuf,0x800,"%s %i","sv_external_port",
                   (ulong)(uint)(this->m_Values).m_SvExternalPort);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_SvMap,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","sv_map",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvMaxClients != 8)) {
        str_format(aLineBuf,0x800,"%s %i","sv_max_clients",
                   (ulong)(uint)(this->m_Values).m_SvMaxClients);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvMaxClientsPerIP != 4)) {
        str_format(aLineBuf,0x800,"%s %i","sv_max_clients_per_ip",
                   (ulong)(uint)(this->m_Values).m_SvMaxClientsPerIP);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvMapDownloadSpeed != 8)) {
        str_format(aLineBuf,0x800,"%s %i","sv_map_download_speed",
                   (ulong)(uint)(this->m_Values).m_SvMapDownloadSpeed);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvHighBandwidth != 0)) {
        str_format(aLineBuf,0x800,"%s %i","sv_high_bandwidth",
                   (ulong)(uint)(this->m_Values).m_SvHighBandwidth);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvRegister != 1)) {
        str_format(aLineBuf,0x800,"%s %i","sv_register",(ulong)(uint)(this->m_Values).m_SvRegister);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_SvRconPassword,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","sv_rcon_password",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_SvRconModPassword,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","sv_rcon_mod_password",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvRconMaxTries != 3)) {
        str_format(aLineBuf,0x800,"%s %i","sv_rcon_max_tries",
                   (ulong)(uint)(this->m_Values).m_SvRconMaxTries);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvRconBantime != 5)) {
        str_format(aLineBuf,0x800,"%s %i","sv_rcon_bantime",
                   (ulong)(uint)(this->m_Values).m_SvRconBantime);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvAutoDemoRecord != 0)) {
        str_format(aLineBuf,0x800,"%s %i","sv_auto_demo_record",
                   (ulong)(uint)(this->m_Values).m_SvAutoDemoRecord);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && ((this->m_Values).m_SvAutoDemoMax != 10)) {
        str_format(aLineBuf,0x800,"%s %i","sv_auto_demo_max",
                   (ulong)(uint)(this->m_Values).m_SvAutoDemoMax);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 5U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_SvMaplist,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","sv_maplist",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 0x21U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_EcBindaddr,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","ec_bindaddr",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 0x21U) != 0) && ((this->m_Values).m_EcPort != 0)) {
        str_format(aLineBuf,0x800,"%s %i","ec_port",(ulong)(uint)(this->m_Values).m_EcPort);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 0x21U) != 0) && (iVar2 = str_comp(a,b), iVar2 != 0)) {
        EscapeParam(aEscapeBuf,(this->m_Values).m_EcPassword,0x800);
        str_format(aLineBuf,0x800,"%s \"%s\"","ec_password",aEscapeBuf);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 0x21U) != 0) && ((this->m_Values).m_EcBantime != 0)) {
        str_format(aLineBuf,0x800,"%s %i","ec_bantime",(ulong)(uint)(this->m_Values).m_EcBantime);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 0x21U) != 0) && ((this->m_Values).m_EcAuthTimeout != 0x1e)) {
        str_format(aLineBuf,0x800,"%s %i","ec_auth_timeout",
                   (ulong)(uint)(this->m_Values).m_EcAuthTimeout);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 0x21U) != 0) && ((this->m_Values).m_EcOutputLevel != 1)) {
        str_format(aLineBuf,0x800,"%s %i","ec_output_level",
                   (ulong)(uint)(this->m_Values).m_EcOutputLevel);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      if (((this->m_FlagMask & 0x25U) != 0) && ((this->m_Values).m_NetTcpAbortOnClose != 0)) {
        str_format(aLineBuf,0x800,"%s %i","net_tcp_abort_on_close",
                   (ulong)(uint)(this->m_Values).m_NetTcpAbortOnClose);
        (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      }
      for (i = 0; i < this->m_NumCallbacks; i = i + 1) {
        (*this->m_aCallbacks[i].m_pfnFunc)
                  (&this->super_IConfigManager,this->m_aCallbacks[i].m_pUserData);
      }
      io_close((IOHANDLE)0x13a549);
      if (this->m_pConsole != (IConsole *)0x0) {
        str_format(aBuf,0x100,"saved config to \'%s\'",pFilename_local);
        (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                  (this->m_pConsole,0,"config",aBuf);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConfigManager::Save(const char *pFilename)
{
	if(!m_pStorage)
		return;

	if(!pFilename)
		pFilename = SETTINGS_FILENAME ".cfg";
	m_ConfigFile = m_pStorage->OpenFile(pFilename, IOFLAG_WRITE, IStorage::TYPE_SAVE);

	if(!m_ConfigFile)
		return;

	WriteLine("# Teeworlds " GAME_VERSION);

	char aLineBuf[1024*2];
	char aEscapeBuf[1024*2];

	#define MACRO_CONFIG_INT(Name,ScriptName,def,min,max,flags,desc) if(((flags)&(CFGFLAG_SAVE))&&((flags)&(m_FlagMask))&&(m_Values.m_##Name!=int(def))){ str_format(aLineBuf, sizeof(aLineBuf), "%s %i", #ScriptName, m_Values.m_##Name); WriteLine(aLineBuf); }
	#define MACRO_CONFIG_STR(Name,ScriptName,len,def,flags,desc) if(((flags)&(CFGFLAG_SAVE))&&((flags)&(m_FlagMask)&&(str_comp(m_Values.m_##Name,def)))){ EscapeParam(aEscapeBuf, m_Values.m_##Name, sizeof(aEscapeBuf)); str_format(aLineBuf, sizeof(aLineBuf), "%s \"%s\"", #ScriptName, aEscapeBuf); WriteLine(aLineBuf); }
	#define MACRO_CONFIG_UTF8STR(Name,ScriptName,size,len,def,flags,desc) if(((flags)&(CFGFLAG_SAVE))&&((flags)&(m_FlagMask)&&(str_comp(m_Values.m_##Name,def)))){ EscapeParam(aEscapeBuf, m_Values.m_##Name, sizeof(aEscapeBuf)); str_format(aLineBuf, sizeof(aLineBuf), "%s \"%s\"", #ScriptName, aEscapeBuf); WriteLine(aLineBuf); }

	#include "config_variables.h"

	#undef MACRO_CONFIG_INT
	#undef MACRO_CONFIG_STR
	#undef MACRO_CONFIG_UTF8STR

	for(int i = 0; i < m_NumCallbacks; i++)
		m_aCallbacks[i].m_pfnFunc(this, m_aCallbacks[i].m_pUserData);

	io_close(m_ConfigFile);

	if(m_pConsole)
	{
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf), "saved config to '%s'", pFilename);
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "config", aBuf);
	}
}